

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.hpp
# Opt level: O0

void __thiscall
helics::TimeCoordinator::TimeCoordinator
          (TimeCoordinator *this,
          function<void_(const_helics::ActionMessage_&)> *userSendMessageFunction)

{
  TimeRepresentation<count_time<9,_long>_> TVar1;
  shared_guarded<std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>,_std::mutex>
  *in_RDI;
  function<void_(const_helics::ActionMessage_&)> *in_stack_ffffffffffffffa8;
  __integral_type_conflict1 __i;
  function<void_(const_helics::ActionMessage_&)> *userSendMessageFunction_00;
  BaseTimeCoordinator *in_stack_ffffffffffffffc0;
  function<void_(const_helics::ActionMessage_&)> local_30;
  
  userSendMessageFunction_00 = &local_30;
  std::function<void_(const_helics::ActionMessage_&)>::function
            ((function<void_(const_helics::ActionMessage_&)> *)in_RDI,in_stack_ffffffffffffffa8);
  BaseTimeCoordinator::BaseTimeCoordinator(in_stack_ffffffffffffffc0,userSendMessageFunction_00);
  CLI::std::function<void_(const_helics::ActionMessage_&)>::~function
            ((function<void_(const_helics::ActionMessage_&)> *)0x58db72);
  *(undefined ***)&((_Function_base *)&in_RDI->m_obj)->_M_functor = &PTR__TimeCoordinator_00a5b628;
  TimeData::TimeData((TimeData *)in_stack_ffffffffffffffc0);
  TimeData::TimeData((TimeData *)in_stack_ffffffffffffffc0);
  TimeData::TimeData((TimeData *)in_stack_ffffffffffffffc0);
  TVar1 = TimeRepresentation<count_time<9,_long>_>::minVal();
  in_RDI[4].m_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)TVar1.internalTimeCode;
  TVar1 = TimeRepresentation<count_time<9,_long>_>::maxVal();
  in_RDI[4].m_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)TVar1.internalTimeCode;
  *(undefined8 *)&((_Function_base *)&in_RDI[5].m_obj)->_M_functor = 0;
  *(undefined8 *)((long)&((_Function_base *)&in_RDI[5].m_obj)->_M_functor + 8) = 0;
  ((_Function_base *)&in_RDI[5].m_obj)->_M_manager = (_Manager_type)0x0;
  TVar1 = TimeRepresentation<count_time<9,_long>_>::minVal();
  in_RDI[5].m_mutex.super___mutex_base._M_mutex.__align = TVar1.internalTimeCode;
  TVar1 = TimeRepresentation<count_time<9,_long>_>::maxVal();
  *(baseType *)((long)&in_RDI[5].m_mutex.super___mutex_base._M_mutex + 8) = TVar1.internalTimeCode;
  TVar1 = TimeRepresentation<count_time<9,_long>_>::maxVal();
  *(baseType *)((long)&in_RDI[5].m_mutex.super___mutex_base._M_mutex + 0x10) =
       TVar1.internalTimeCode;
  TVar1 = TimeRepresentation<count_time<9,_long>_>::maxVal();
  in_RDI[5].m_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)TVar1.internalTimeCode;
  TVar1 = TimeRepresentation<count_time<9,_long>_>::minVal();
  in_RDI[5].m_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)TVar1.internalTimeCode;
  TVar1 = TimeRepresentation<count_time<9,_long>_>::maxVal();
  *(baseType *)&((_Function_base *)&in_RDI[6].m_obj)->_M_functor = TVar1.internalTimeCode;
  TVar1 = TimeRepresentation<count_time<9,_long>_>::maxVal();
  in_RDI[6].m_obj.
  super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)TVar1.internalTimeCode;
  __i = (__integral_type_conflict1)
        ((ulong)&in_RDI[6].m_obj.
                 super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x20);
  gmlc::libguarded::
  shared_guarded<std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>,_std::mutex>
  ::shared_guarded<>(in_RDI);
  gmlc::libguarded::
  shared_guarded<std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>,_std::mutex>
  ::shared_guarded<>(in_RDI);
  std::
  vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
  ::vector((vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
            *)0x58dcb8);
  tcoptions::tcoptions((tcoptions *)in_RDI);
  in_RDI[9].m_mutex.super___mutex_base._M_mutex.__size[0] = '\0';
  in_RDI[9].m_mutex.super___mutex_base._M_mutex.__size[1] = '\0';
  in_RDI[9].m_mutex.super___mutex_base._M_mutex.__size[2] = '\0';
  in_RDI[9].m_mutex.super___mutex_base._M_mutex.__size[3] = '\0';
  in_RDI[9].m_mutex.super___mutex_base._M_mutex.__size[4] = '\0';
  in_RDI[9].m_mutex.super___mutex_base._M_mutex.__size[5] = '\0';
  in_RDI[9].m_mutex.super___mutex_base._M_mutex.__size[6] = '\0';
  in_RDI[9].m_mutex.super___mutex_base._M_mutex.__size[7] = '\0';
  std::atomic<int>::atomic((atomic<int> *)in_RDI,__i);
  return;
}

Assistant:

explicit TimeCoordinator(std::function<void(const ActionMessage&)> userSendMessageFunction):
        BaseTimeCoordinator(std::move(userSendMessageFunction))
    {
    }